

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void form_global_comm(comm_data *local_data,comm_data *global_data,
                     vector<int,_std::allocator<int>_> *local_data_nodes,MPI_Comm mpi_comm,
                     topo_data *topo_info,int tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined8 *puVar8;
  reference pvVar9;
  ulong uVar10;
  void *pvVar11;
  vector<int,_std::allocator<int>_> *this;
  undefined8 in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int j;
  int i_2;
  int i_1;
  int i;
  int size;
  int node;
  int ctr;
  int idx;
  int end;
  int start;
  int node_idx;
  int rank_node;
  int num_nodes;
  MPI_Comm *local_comm;
  int local_num_procs;
  int local_rank;
  int num_procs;
  int rank;
  vector<int,_std::allocator<int>_> node_ctr;
  vector<int,_std::allocator<int>_> node_sizes;
  vector<int,_std::allocator<int>_> tmp_send_indices;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int iVar12;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar13;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar14;
  undefined1 local_88 [4];
  undefined1 local_84 [4];
  undefined1 local_80 [4];
  undefined1 local_7c [4];
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60 [2];
  long local_28;
  undefined8 local_20;
  vector<int,_std::allocator<int>_> *local_18;
  int *local_10;
  int *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x158984);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x158991);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15899e);
  MPI_Comm_rank(local_20,local_7c);
  MPI_Comm_size(local_20,local_80);
  puVar8 = (undefined8 *)(local_28 + 0x10);
  MPI_Comm_rank(*puVar8,local_84);
  MPI_Comm_size(*puVar8,local_88);
  iVar12 = *(int *)(local_28 + 8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (value_type *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  for (uVar14 = 0; (int)uVar14 < *local_8; uVar14 = uVar14 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)(int)uVar14);
    iVar13 = *pvVar9;
    in_stack_ffffffffffffff20 =
         *(int *)(*(long *)(local_8 + 4) + (long)(int)(uVar14 + 1) * 4) -
         *(int *)(*(long *)(local_8 + 4) + (long)(int)uVar14 * 4);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)iVar13);
    if (*pvVar9 == 0) {
      *local_10 = *local_10 + 1;
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)iVar13);
    *pvVar9 = in_stack_ffffffffffffff20 + *pvVar9;
  }
  if (*local_10 != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)*local_10;
    uVar10 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    *(void **)(local_10 + 2) = pvVar11;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(*local_10 + 1);
  uVar10 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  this = (vector<int,_std::allocator<int>_> *)operator_new__(uVar10);
  *(vector<int,_std::allocator<int>_> **)(local_10 + 4) = this;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)((ulong)uVar14 << 0x20),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (value_type *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  *local_10 = 0;
  **(undefined4 **)(local_10 + 4) = 0;
  for (iVar13 = 0; iVar13 < iVar12; iVar13 = iVar13 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)iVar13);
    if (*pvVar9 != 0) {
      *(int *)(*(long *)(local_10 + 2) + (long)*local_10 * 4) = iVar13;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)iVar13);
      local_10[1] = *pvVar9 + local_10[1];
      iVar7 = *local_10;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)iVar13);
      *pvVar9 = iVar7;
      *local_10 = *local_10 + 1;
      *(int *)(*(long *)(local_10 + 4) + (long)*local_10 * 4) = local_10[1];
    }
  }
  if (local_10[1] != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)local_10[1];
    uVar10 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    *(void **)(local_10 + 6) = pvVar11;
  }
  for (iVar12 = 0; iVar12 < *local_8; iVar12 = iVar12 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)iVar12);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)*pvVar9);
    iVar13 = *pvVar9;
    iVar1 = *(int *)(*(long *)(local_8 + 4) + (long)(iVar12 + 1) * 4);
    for (iVar7 = *(int *)(*(long *)(local_8 + 4) + (long)iVar12 * 4); iVar7 < iVar1;
        iVar7 = iVar7 + 1) {
      iVar2 = *(int *)(*(long *)(local_10 + 4) + (long)iVar13 * 4);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar13);
      iVar3 = *pvVar9;
      *pvVar9 = iVar3 + 1;
      *(undefined4 *)(*(long *)(local_10 + 6) + (long)(iVar2 + iVar3) * 4) =
           *(undefined4 *)(*(long *)(local_8 + 6) + (long)iVar7 * 4);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return;
}

Assistant:

static void form_global_comm(comm_data* local_data, comm_data* global_data,
        std::vector<int>& local_data_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, int tag)
{
    std::vector<int> tmp_send_indices;
    std::vector<int> node_sizes;
    std::vector<int> node_ctr;

    // Get MPI Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);
    int num_nodes = topo_info->num_nodes;
    int rank_node = topo_info->rank_node;

    int node_idx;
    int start, end, idx;
    int ctr, node, size;

    node_sizes.resize(num_nodes, 0);

    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        size = local_data->indptr[i+1] - local_data->indptr[i];
        if (node_sizes[node] == 0)
        {
            global_data->num_msgs++;
        }
        node_sizes[node] += size;
    }
    if (global_data->num_msgs)
        global_data->procs = new int[global_data->num_msgs];
    global_data->indptr = new int[global_data->num_msgs+1];
    node_ctr.resize(global_data->num_msgs, 0);

    global_data->num_msgs = 0;
    global_data->indptr[0] = 0;
    for (int i = 0; i < num_nodes; i++)
    {
        if (node_sizes[i])
        {
            global_data->procs[global_data->num_msgs] = i;
            global_data->size_msgs += node_sizes[i];
            node_sizes[i] = global_data->num_msgs;
            global_data->num_msgs++;
            global_data->indptr[global_data->num_msgs] = global_data->size_msgs;
        }
    }

    if (global_data->size_msgs)
        global_data->indices = new int[global_data->size_msgs];
    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        node_idx = node_sizes[node];
        start = local_data->indptr[i];
        end = local_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = global_data->indptr[node_idx] + node_ctr[node_idx]++;
            global_data->indices[idx] = local_data->indices[j];
        }
    }
}